

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O0

int TVMArrayCopyFromBytes(TVMArrayHandle handle,void *data,size_t nbytes)

{
  TVMContext ctx;
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  DeviceAPI *pDVar4;
  runtime_error *_except_;
  LogMessageFatal local_1e0;
  LogCheckError local_58;
  LogCheckError _check_err;
  size_t local_40;
  size_t arr_size;
  TVMContext cpu_ctx;
  size_t nbytes_local;
  void *data_local;
  TVMArrayHandle handle_local;
  
  arr_size._0_4_ = 1;
  arr_size._4_4_ = 0;
  cpu_ctx = (TVMContext)nbytes;
  local_40 = tvm::runtime::GetDataSize(handle);
  dmlc::LogCheck_EQ<unsigned_long,unsigned_long>
            ((dmlc *)&local_58,&local_40,(unsigned_long *)&cpu_ctx);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_58);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/ndarray.cc"
               ,0x101);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1e0);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"arr_size == nbytes");
    poVar3 = std::operator<<(poVar3,(string *)local_58.str);
    poVar3 = std::operator<<(poVar3,": ");
    std::operator<<(poVar3,"TVMArrayCopyFromBytes: size mismatch");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1e0);
  }
  dmlc::LogCheckError::~LogCheckError(&local_58);
  ctx.device_type = (handle->ctx).device_type;
  ctx.device_id = (handle->ctx).device_id;
  pDVar4 = tvm::runtime::DeviceAPI::Get(ctx,false);
  (*pDVar4->_vptr_DeviceAPI[6])
            (pDVar4,data,0,handle->data,handle->byte_offset,cpu_ctx,
             CONCAT44(arr_size._4_4_,(undefined4)arr_size),handle->ctx,handle->dtype,0);
  return 0;
}

Assistant:

int TVMArrayCopyFromBytes(TVMArrayHandle handle,
                          void *data,
                          size_t nbytes) {
  API_BEGIN();
  TVMContext cpu_ctx;
  cpu_ctx.device_type = kDLCPU;
  cpu_ctx.device_id = 0;
  size_t arr_size = GetDataSize(*handle);
  CHECK_EQ(arr_size, nbytes)
      << "TVMArrayCopyFromBytes: size mismatch";
  DeviceAPI::Get(handle->ctx)->CopyDataFromTo(data, 0, handle->data, static_cast<size_t>(handle->byte_offset), nbytes, cpu_ctx, handle->ctx, handle->dtype, nullptr);
  API_END();
}